

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

bool __thiscall
pybind11::detail::values_and_holders::is_redundant_value_and_holder
          (values_and_holders *this,value_and_holder *vh)

{
  PyTypeObject *pPVar1;
  int iVar2;
  const_reference pptVar3;
  ulong local_28;
  size_t i;
  value_and_holder *vh_local;
  values_and_holders *this_local;
  
  local_28 = 0;
  while( true ) {
    if (vh->index <= local_28) {
      return false;
    }
    pptVar3 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](this->tinfo,local_28);
    pPVar1 = (*pptVar3)->type;
    pptVar3 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](this->tinfo,vh->index);
    iVar2 = PyType_IsSubtype(pPVar1,(*pptVar3)->type);
    if (iVar2 != 0) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool is_redundant_value_and_holder(const value_and_holder &vh) {
        for (size_t i = 0; i < vh.index; i++) {
            if (PyType_IsSubtype(tinfo[i]->type, tinfo[vh.index]->type) != 0) {
                return true;
            }
        }
        return false;
    }